

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redirect_path.c
# Opt level: O2

void apprun_load_path_mappings(void)

{
  char *pcVar1;
  size_t sVar2;
  apprun_path_mapping **ppaVar3;
  char *pcVar4;
  char *pcVar5;
  apprun_path_mapping *paVar6;
  int i;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  pcVar1 = getenv("APPDIR_PATH_MAPPINGS");
  if ((pcVar1 != (char *)0x0) && (apprun_path_mappings == (apprun_path_mapping **)0x0)) {
    sVar2 = strlen(pcVar1);
    uVar8 = apprun_path_mappings_size;
    for (sVar7 = 0; sVar2 != sVar7; sVar7 = sVar7 + 1) {
      if (pcVar1[sVar7] == ';') {
        uVar8 = uVar8 + 1;
        apprun_path_mappings_size = uVar8;
      }
    }
    ppaVar3 = (apprun_path_mapping **)malloc((long)(int)uVar8 << 3);
    uVar10 = 0;
    apprun_path_mappings = ppaVar3;
    uVar9 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar9 = uVar10;
    }
    for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      pcVar4 = strchr(pcVar1,0x3a);
      pcVar5 = strchr(pcVar1,0x3b);
      if (pcVar5 != (char *)0x0 && pcVar4 != (char *)0x0) {
        paVar6 = (apprun_path_mapping *)malloc(0x10);
        pcVar1 = strndup(pcVar1,(long)pcVar4 - (long)pcVar1);
        paVar6->path = pcVar1;
        pcVar1 = strndup(pcVar4 + 1,(size_t)(pcVar5 + ~(ulong)pcVar4));
        paVar6->mapping = pcVar1;
        ppaVar3[uVar10] = paVar6;
      }
      pcVar1 = pcVar5 + 1;
    }
  }
  return;
}

Assistant:

void apprun_load_path_mappings() {
    char *path_mappings_env = getenv(APPDIR_PATH_MAPPINGS_ENV);
    if (path_mappings_env == NULL || apprun_path_mappings != NULL) {
        return;
    }

    for (int i = 0; i < strlen(path_mappings_env); i++) {
        if (path_mappings_env[i] == ';')
            apprun_path_mappings_size++;
    }

    apprun_path_mappings = malloc(sizeof(apprun_path_mapping *) * apprun_path_mappings_size);

    char *str_itr = path_mappings_env;
    for (int i = 0; i < apprun_path_mappings_size; i++) {

        char *colon_pos, *semicolon_pos;

        colon_pos = strchr(str_itr, ':');
        semicolon_pos = strchr(str_itr, ';');
        if (colon_pos && semicolon_pos) {
            apprun_path_mapping *mapping;
            mapping = malloc(sizeof(apprun_path_mapping));
            mapping->path = strndup(str_itr, colon_pos - str_itr);
            mapping->mapping = strndup(colon_pos + 1, semicolon_pos - colon_pos - 1);
            apprun_path_mappings[i] = mapping;
        }

        str_itr = semicolon_pos + 1;
    }
}